

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool list_reversed(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  undefined8 *puVar1;
  gravity_object_t *pgVar2;
  char *pcVar3;
  size_t sVar4;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar6;
  gravity_value_t *pgVar7;
  gravity_fiber_t *fiber;
  char *pcVar8;
  long lVar10;
  gravity_value_t value;
  char _buffer [4096];
  char local_1038 [4104];
  gravity_class_t *pgVar9;
  
  if (nargs < 2) {
    pgVar2 = (args->field_1).p;
    aVar6.p = (gravity_object_t *)gravity_list_new(vm,*(uint32_t *)&pgVar2->objclass);
    if ((ulong)*(uint *)&pgVar2->objclass != 0) {
      lVar10 = (ulong)*(uint *)&pgVar2->objclass << 4;
      do {
        pcVar3 = (aVar6.p)->identifier;
        if ((char *)((gravity_value_r *)&(aVar6.p)->objclass)->n == pcVar3) {
          pcVar8 = (char *)((long)pcVar3 * 2);
          if (pcVar3 == (char *)0x0) {
            pcVar8 = (char *)0x8;
          }
          (aVar6.p)->identifier = pcVar8;
          pgVar7 = (gravity_value_t *)
                   realloc(*(gravity_value_t **)&(aVar6.p)->has_outer,(long)pcVar8 << 4);
          *(gravity_value_t **)&(aVar6.p)->has_outer = pgVar7;
        }
        sVar4 = ((gravity_value_r *)&(aVar6.p)->objclass)->n;
        pgVar7 = *(gravity_value_t **)&(aVar6.p)->has_outer;
        ((gravity_value_r *)&(aVar6.p)->objclass)->n = sVar4 + 1;
        puVar1 = (undefined8 *)(*(long *)&pgVar2->has_outer + -0x10 + lVar10);
        aVar5 = *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(puVar1 + 1);
        pgVar7[sVar4].isa = (gravity_class_t *)*puVar1;
        pgVar7[sVar4].field_1 = aVar5;
        lVar10 = lVar10 + -0x10;
      } while (lVar10 != 0);
    }
    pgVar9 = (aVar6.p)->isa;
  }
  else {
    builtin_strncpy(local_1038,"Incorrect number of arguments.",0x1f);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1038);
    aVar6.n = 0;
    pgVar9 = gravity_class_null;
  }
  value.field_1.n = aVar6.n;
  value.isa = pgVar9;
  gravity_vm_setslot(vm,value,rindex);
  return nargs < 2;
}

Assistant:

static bool list_reversed (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs > 1) RETURN_ERROR("Incorrect number of arguments.");
    
    // self parameter
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));
    gravity_list_t *newlist = gravity_list_new(vm, (uint32_t)list->array.n);
    uint32_t count = (uint32_t)marray_size(list->array);
    gravity_int_t i = 0;

    while (i < count) {
        marray_push(gravity_value_t, newlist->array, marray_get(list->array, count-i-1));
        ++i;
    }

    RETURN_VALUE(VALUE_FROM_OBJECT(newlist), rindex);
}